

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

char16_t * __thiscall QtPrivate::qustrchr(QtPrivate *this,QStringView str,char16_t c)

{
  short *psVar1;
  short *psVar2;
  uint uVar3;
  ushort uVar4;
  short *psVar5;
  char16_t *pcVar6;
  long in_FS_OFFSET;
  short sVar7;
  undefined1 auVar8 [16];
  short local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a = (short)str.m_data;
  psVar2 = (short *)str.m_size + (long)this;
  psVar5 = (short *)str.m_size;
  do {
    psVar1 = psVar5 + 8;
    if (psVar2 < psVar1) {
      pcVar6 = std::__find_if<char16_t_const*,__gnu_cxx::__ops::_Iter_equals_val<char16_t_const>>
                         (psVar5,psVar2,&local_a);
      goto LAB_00320f61;
    }
    auVar8._0_2_ = -(ushort)(*psVar5 == local_a);
    sVar7 = (short)(((uint)str.m_data << 0x10 | (uint)str.m_data) >> 0x10);
    auVar8._2_2_ = -(ushort)(psVar5[1] == sVar7);
    auVar8._4_2_ = -(ushort)(psVar5[2] == local_a);
    auVar8._6_2_ = -(ushort)(psVar5[3] == sVar7);
    auVar8._8_2_ = -(ushort)(psVar5[4] == local_a);
    auVar8._10_2_ = -(ushort)(psVar5[5] == sVar7);
    auVar8._12_2_ = -(ushort)(psVar5[6] == local_a);
    auVar8._14_2_ = -(ushort)(psVar5[7] == sVar7);
    uVar4 = (ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
            (ushort)((byte)(auVar8._14_2_ >> 7) & 1) << 0xe | auVar8._14_2_ & 0x8000;
    psVar5 = psVar1;
  } while (uVar4 == 0);
  uVar3 = 0;
  if (uVar4 != 0) {
    for (; (uVar4 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
    }
  }
  pcVar6 = (char16_t *)((long)psVar1 + ((ulong)(uVar3 & 0x1e) - 0x10));
LAB_00320f61:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pcVar6;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE
const char16_t *QtPrivate::qustrchr(QStringView str, char16_t c) noexcept
{
    const char16_t *n = str.utf16();
    const char16_t *e = n + str.size();

#ifdef __SSE2__
    bool loops = true;
    // Using the PMOVMSKB instruction, we get two bits for each character
    // we compare.
    __m128i mch;
    if constexpr (UseAvx2) {
        // we're going to read n[0..15] (32 bytes)
        __m256i mch256 = _mm256_set1_epi32(c | (c << 16));
        for (const char16_t *next = n + 16; next <= e; n = next, next += 16) {
            __m256i data = _mm256_loadu_si256(reinterpret_cast<const __m256i *>(n));
            __m256i result = _mm256_cmpeq_epi16(data, mch256);
            uint mask = uint(_mm256_movemask_epi8(result));
            if (mask) {
                uint idx = qCountTrailingZeroBits(mask);
                return n + idx / 2;
            }
        }
        loops = false;
        mch = _mm256_castsi256_si128(mch256);
    } else {
        mch = _mm_set1_epi32(c | (c << 16));
    }

    auto hasMatch = [mch, &n](__m128i data, ushort validityMask) {
        __m128i result = _mm_cmpeq_epi16(data, mch);
        uint mask = uint(_mm_movemask_epi8(result));
        if ((mask & validityMask) == 0)
            return false;
        uint idx = qCountTrailingZeroBits(mask);
        n += idx / 2;
        return true;
    };

    // we're going to read n[0..7] (16 bytes)
    for (const char16_t *next = n + 8; next <= e; n = next, next += 8) {
        __m128i data = _mm_loadu_si128(reinterpret_cast<const __m128i *>(n));
        if (hasMatch(data, 0xffff))
            return n;

        if (!loops) {
            n += 8;
            break;
        }
    }

#  if !defined(__OPTIMIZE_SIZE__)
    // we're going to read n[0..3] (8 bytes)
    if (e - n > 3) {
        __m128i data = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(n));
        if (hasMatch(data, 0xff))
            return n;

        n += 4;
    }

    return UnrollTailLoop<3>::exec(e - n, e,
                                   [=](qsizetype i) { return n[i] == c; },
                                   [=](qsizetype i) { return n + i; });
#  endif
#elif defined(__ARM_NEON__)
    const uint16x8_t vmask = qvsetq_n_u16(1, 1 << 1, 1 << 2, 1 << 3, 1 << 4, 1 << 5, 1 << 6, 1 << 7);
    const uint16x8_t ch_vec = vdupq_n_u16(c);
    for (const char16_t *next = n + 8; next <= e; n = next, next += 8) {
        uint16x8_t data = vld1q_u16(reinterpret_cast<const uint16_t *>(n));
        uint mask = vaddvq_u16(vandq_u16(vceqq_u16(data, ch_vec), vmask));
        if (ushort(mask)) {
            // found a match
            return n + qCountTrailingZeroBits(mask);
        }
    }
#endif // aarch64

    return std::find(n, e, c);
}